

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O1

QList<QUrl> * __thiscall
QFileDialogPrivate::addDefaultSuffixToUrls
          (QList<QUrl> *__return_storage_ptr__,QFileDialogPrivate *this,QList<QUrl> *urlsToFix)

{
  int *piVar1;
  storage_type_conflict *psVar2;
  qsizetype originalLength;
  CutResult CVar3;
  undefined1 *puVar4;
  long lVar5;
  long lVar6;
  storage_type_conflict *psVar7;
  QString *pQVar8;
  QUrl *pQVar9;
  long in_FS_OFFSET;
  QStringView QVar10;
  QStringView QVar11;
  QStringView QVar12;
  QUrl url;
  QString local_a0;
  QString local_88;
  QUrl local_70;
  QString local_68;
  QStringBuilder<QStringBuilder<const_QString_&,_char16_t>,_const_QString_&> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QUrl *)0x0;
  (__return_storage_ptr__->d).size = 0;
  QList<QUrl>::reserve(__return_storage_ptr__,(urlsToFix->d).size);
  local_68.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_68.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_68.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QFileDialogOptions::defaultSuffix();
  lVar6 = (urlsToFix->d).size;
  if (lVar6 != 0) {
    pQVar9 = (urlsToFix->d).ptr;
    lVar6 = lVar6 << 3;
    do {
      local_70.d = (QUrlPrivate *)&DAT_aaaaaaaaaaaaaaaa;
      QUrl::QUrl(&local_70,pQVar9);
      if ((undefined1 *)local_68.d.size != (undefined1 *)0x0) {
        local_88.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_88.d.d._0_4_ = 0xaaaaaaaa;
        local_88.d.d._4_4_ = 0xaaaaaaaa;
        local_88.d.ptr._0_4_ = 0xaaaaaaaa;
        local_88.d.ptr._4_4_ = 0xaaaaaaaa;
        QUrl::path(&local_88,&local_70,0x7f00000);
        originalLength = local_88.d.size;
        psVar2 = (storage_type_conflict *)CONCAT44(local_88.d.ptr._4_4_,local_88.d.ptr._0_4_);
        QVar10.m_data = psVar2;
        QVar10.m_size = local_88.d.size;
        puVar4 = (undefined1 *)QtPrivate::lastIndexOf(QVar10,-1,L'/',CaseSensitive);
        if (puVar4 != (undefined1 *)(originalLength + -1)) {
          local_a0.d.d = (Data *)(puVar4 + 1);
          local_50.a.a = (QString *)0xffffffffffffffff;
          CVar3 = QtPrivate::QContainerImplHelper::mid
                            (originalLength,(qsizetype *)&local_a0,(qsizetype *)&local_50);
          psVar7 = (storage_type_conflict *)0x0;
          pQVar8 = (QString *)0x0;
          if (CVar3 != Null) {
            psVar7 = psVar2 + (long)local_a0.d.d;
            pQVar8 = local_50.a.a;
          }
          local_a0.d.d = (Data *)CONCAT62(local_a0.d.d._2_6_,0x2e);
          QVar11.m_data = psVar7;
          QVar11.m_size = (qsizetype)pQVar8;
          QVar12.m_data = (storage_type_conflict *)&local_a0;
          QVar12.m_size = 1;
          lVar5 = QtPrivate::findString(QVar11,0,QVar12,CaseSensitive);
          if (lVar5 == -1) {
            local_50.a.a = &local_88;
            local_50.a.b = L'.';
            local_50.b = &local_68;
            QStringBuilder<QStringBuilder<const_QString_&,_char16_t>,_const_QString_&>::
            convertTo<QString>(&local_a0,&local_50);
            QUrl::setPath((QString *)&local_70,(ParsingMode)&local_a0);
            if (&(local_a0.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_a0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_a0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_a0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate(&(local_a0.d.d)->super_QArrayData,2,0x10);
              }
            }
          }
        }
        piVar1 = (int *)CONCAT44(local_88.d.d._4_4_,local_88.d.d._0_4_);
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (*piVar1 == 0) {
            QArrayData::deallocate
                      ((QArrayData *)CONCAT44(local_88.d.d._4_4_,local_88.d.d._0_4_),2,0x10);
          }
        }
      }
      QtPrivate::QMovableArrayOps<QUrl>::emplace<QUrl_const&>
                ((QMovableArrayOps<QUrl> *)__return_storage_ptr__,(__return_storage_ptr__->d).size,
                 &local_70);
      QList<QUrl>::end(__return_storage_ptr__);
      QUrl::~QUrl(&local_70);
      pQVar9 = pQVar9 + 1;
      lVar6 = lVar6 + -8;
    } while (lVar6 != 0);
  }
  if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QList<QUrl> QFileDialogPrivate::addDefaultSuffixToUrls(const QList<QUrl> &urlsToFix) const
{
    QList<QUrl> urls;
    urls.reserve(urlsToFix.size());
    // if the filename has no suffix, add the default suffix
    const QString defaultSuffix = options->defaultSuffix();
    for (QUrl url : urlsToFix) {
        if (!defaultSuffix.isEmpty()) {
            const QString urlPath = url.path();
            const auto idx = urlPath.lastIndexOf(u'/');
            if (idx != (urlPath.size() - 1) && !QStringView{urlPath}.mid(idx + 1).contains(u'.'))
                url.setPath(urlPath + u'.' + defaultSuffix);
        }
        urls.append(url);
    }
    return urls;
}